

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Apu.cpp
# Opt level: O3

void __thiscall Sap_Apu_Impl::Sap_Apu_Impl(Sap_Apu_Impl *this)

{
  byte *pbVar1;
  int b;
  int iVar2;
  int iVar3;
  int bits_2;
  uint uVar4;
  uint uVar5;
  
  Blip_Synth_::Blip_Synth_((Blip_Synth_ *)this,(this->synth).impulses,0xc);
  pbVar1 = this->poly4;
  uVar4 = 1;
  iVar3 = 2;
  do {
    uVar5 = 0;
    iVar2 = 0;
    do {
      uVar5 = uVar5 | (uVar4 & 1) << ((byte)iVar2 & 0x1f);
      uVar4 = -(uVar4 & 1) & 0xc ^ uVar4 >> 1;
      iVar2 = iVar2 + 1;
    } while (iVar2 != 8);
    *pbVar1 = (byte)uVar5;
    pbVar1 = pbVar1 + 1;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  pbVar1 = this->poly9;
  uVar4 = 1;
  iVar3 = 0x40;
  do {
    uVar5 = 0;
    iVar2 = 0;
    do {
      uVar5 = uVar5 | (uVar4 & 1) << ((byte)iVar2 & 0x1f);
      uVar4 = -(uVar4 & 1) & 0x108 ^ uVar4 >> 1;
      iVar2 = iVar2 + 1;
    } while (iVar2 != 8);
    *pbVar1 = (byte)uVar5;
    pbVar1 = pbVar1 + 1;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  pbVar1 = this->poly17;
  uVar4 = 1;
  iVar3 = 0x4000;
  do {
    uVar5 = 0;
    iVar2 = 0;
    do {
      uVar5 = uVar5 | (uVar4 & 1) << ((byte)iVar2 & 0x1f);
      uVar4 = -(uVar4 & 1) & 0x10800 ^ uVar4 >> 1;
      iVar2 = iVar2 + 1;
    } while (iVar2 != 8);
    *pbVar1 = (byte)uVar5;
    pbVar1 = pbVar1 + 1;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return;
}

Assistant:

Sap_Apu_Impl::Sap_Apu_Impl()
{
	gen_poly( POLY_MASK(  4, 1, 0 ), sizeof poly4,  poly4  );
	gen_poly( POLY_MASK(  9, 5, 0 ), sizeof poly9,  poly9  );
	gen_poly( POLY_MASK( 17, 5, 0 ), sizeof poly17, poly17 );
	
	if ( 0 ) // comment out to recauculate poly5 constant
	{
		byte poly5 [4];
		gen_poly( POLY_MASK(  5, 2, 0 ), sizeof poly5,  poly5  );
		blargg_ulong n = poly5 [3] * 0x1000000L + poly5 [2] * 0x10000L + 
				poly5 [1] * 0x100L + poly5 [0];
		blargg_ulong rev = n & 1;
		for ( int i = 1; i < poly5_len; i++ )
			rev |= (n >> i & 1) << (poly5_len - i);
		debug_printf( "poly5: 0x%08lX\n", rev );
	}
}